

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t spvtools::val::MaximalReconvergenceChecks(ValidationState_t *_)

{
  uint32_t *puVar1;
  pointer pIVar2;
  undefined8 *puVar3;
  pointer ppVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *psVar8;
  _Rb_tree_header *p_Var9;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar10;
  size_type sVar11;
  _Rb_tree_node_base *p_Var12;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar13;
  Instruction *inst_00;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  _Base_ptr p_Var14;
  pointer ppVar15;
  _Base_ptr p_Var16;
  pointer pFVar17;
  int iVar18;
  spv_result_t sVar19;
  Function *func;
  uint32_t *puVar20;
  undefined8 *puVar21;
  pointer pFVar22;
  Instruction *inst;
  pointer this;
  bool bVar23;
  uint id;
  uint entry_point;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_funcs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_entry_points;
  spv_result_t local_2e0;
  _Rb_tree_color local_2dc;
  pointer local_2d8;
  uint32_t local_2cc;
  Function *local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  undefined1 local_2b0 [56];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_278;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_240;
  undefined1 local_208 [16];
  _Link_type local_1f8;
  _Rb_tree_node_base *local_1f0;
  spv_result_t local_38;
  
  local_278._M_buckets = &local_278._M_single_bucket;
  local_278._M_bucket_count = 1;
  local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278._M_element_count = 0;
  local_278._M_rehash_policy._M_max_load_factor = 1.0;
  local_278._M_rehash_policy._M_next_resize = 0;
  local_278._M_single_bucket = (__node_base_ptr)0x0;
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  puVar20 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != puVar1) {
    do {
      local_2b0._0_4_ = *puVar20;
      psVar8 = ValidationState_t::GetExecutionModes(_,*puVar20);
      if (psVar8 != (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     *)0x0) {
        p_Var9 = &(psVar8->_M_t)._M_impl.super__Rb_tree_header;
        p_Var16 = (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var14 = &p_Var9->_M_header;
        for (; p_Var16 != (_Base_ptr)0x0; p_Var16 = (&p_Var16->_M_left)[bVar23]) {
          bVar23 = p_Var16[1]._M_color < 0x1787;
          if (!bVar23) {
            p_Var14 = p_Var16;
          }
        }
        p_Var16 = &p_Var9->_M_header;
        if (((_Rb_tree_header *)p_Var14 != p_Var9) &&
           (p_Var16 = p_Var14, 0x1787 < p_Var14[1]._M_color)) {
          p_Var16 = &p_Var9->_M_header;
        }
        if ((_Rb_tree_header *)p_Var16 != p_Var9) {
          local_208._0_8_ = &local_240;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_240,local_2b0,local_208);
          local_208._0_8_ = &local_278;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_278,local_2b0,local_208);
        }
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar1);
  }
  sVar19 = SPV_SUCCESS;
  if (local_240._M_element_count != 0) {
    pvVar10 = ValidationState_t::functions(_);
    pFVar22 = (pvVar10->
              super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    local_2d8 = (pvVar10->
                super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar22 != local_2d8) {
      do {
        ValidationState_t::EntryPointReferences
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_208,_,pFVar22->id_);
        for (p_Var12 = local_1f0; p_Var12 != (_Rb_tree_node_base *)(local_208 + 8);
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          local_2dc = p_Var12[1]._M_color;
          sVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&local_240,&local_2dc);
          if (sVar11 != 0) {
            local_2cc = pFVar22->id_;
            local_2b0._0_8_ = &local_278;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_2b0._0_8_,&local_2cc,local_2b0);
            break;
          }
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_208,local_1f8);
        pFVar22 = pFVar22 + 1;
      } while (pFVar22 != local_2d8);
    }
    this = (_->ordered_instructions_).
           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (_->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar23 = this == pIVar2;
    if (!bVar23) {
      do {
        bVar5 = true;
        if ((this->inst_).opcode == 0xfa) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(this,1);
          uVar7 = Instruction::GetOperandAs<unsigned_int>(this,2);
          if (uVar6 == uVar7) {
            local_208._0_4_ = this->function_->id_;
            sVar11 = std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&local_278,(key_type_conflict *)local_208);
            if (sVar11 != 0) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,
                         "In entry points using the MaximallyReconvergesKHR execution mode, True Label and False Label must be different labels"
                         ,0x75);
              local_2e0 = local_38;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar5 = false;
            }
          }
        }
        if (!bVar5) break;
        this = this + 1;
        bVar23 = this == pIVar2;
      } while (!bVar23);
    }
    sVar19 = local_2e0;
    if (bVar23) {
      pvVar10 = ValidationState_t::functions(_);
      pFVar22 = (pvVar10->
                super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_2c0 = (pvVar10->
                  super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      sVar19 = SPV_SUCCESS;
      if (pFVar22 != local_2c0) {
        do {
          local_208._0_4_ = pFVar22->id_;
          sVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&local_278,(key_type_conflict *)local_208);
          if (sVar11 == 0) {
            iVar18 = 0xb;
          }
          else {
            pvVar13 = Function::ordered_blocks(pFVar22);
            pFVar17 = (pointer)(pvVar13->
                               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
            local_2b8 = (pointer)(pvVar13->
                                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
            iVar18 = 0xc;
            if (pFVar17 != local_2b8) {
              do {
                local_2c8 = pFVar22;
                puVar20 = *(uint32_t **)pFVar17;
                local_2b0._0_8_ = local_2b0 + 0x30;
                local_2b0._8_8_ = 1;
                local_2b0._16_8_ = (_Hash_node_base *)0x0;
                local_2b0._24_8_ = 0;
                local_2b0._32_4_ = 1.0;
                local_2b0._40_8_ = 0;
                local_2b0._48_8_ = (__node_base_ptr)0x0;
                puVar3 = *(undefined8 **)(puVar20 + 10);
                local_2d8 = pFVar17;
                for (puVar21 = *(undefined8 **)(puVar20 + 8); puVar21 != puVar3;
                    puVar21 = puVar21 + 1) {
                  local_2dc = *(_Rb_tree_color *)*puVar21;
                  local_208._0_8_ =
                       (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_2b0;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_2b0,&local_2dc,local_208);
                }
                iVar18 = 0xd;
                if ((1 < (ulong)local_2b0._24_8_) &&
                   (*(short *)(*(long *)(puVar20 + 0x1a) + -0x4e) != 0xf6)) {
                  inst_00 = ValidationState_t::FindDef(_,*puVar20);
                  ppVar15 = (inst_00->uses_).
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppVar4 = (inst_00->uses_).
                           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (ppVar15 != ppVar4) {
                    bVar23 = false;
                    do {
                      uVar6 = (ppVar15->first->inst_).opcode - 0xf6;
                      if ((uVar6 < 6) && ((0x23U >> (uVar6 & 0x1f) & 1) != 0)) {
                        bVar23 = true;
                      }
                      ppVar15 = ppVar15 + 1;
                    } while (ppVar15 != ppVar4);
                    iVar18 = 0;
                    if (bVar23) goto LAB_002c8d41;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,inst_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,
                             "In entry points using the MaximallyReconvergesKHR execution mode, this basic block must not have multiple unique predecessors"
                             ,0x7d);
                  local_2e0 = local_38;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  iVar18 = 1;
                }
LAB_002c8d41:
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)local_2b0);
                pFVar22 = local_2c8;
                if ((iVar18 != 0xd) && (iVar18 != 0)) goto LAB_002c8d80;
                pFVar17 = (pointer)&local_2d8->result_type_id_;
              } while (pFVar17 != local_2b8);
              iVar18 = 0xc;
            }
LAB_002c8d80:
            if (iVar18 == 0xc) {
              iVar18 = 0;
            }
          }
          if ((iVar18 != 0xb) && (sVar19 = local_2e0, iVar18 != 0)) goto LAB_002c8db6;
          pFVar22 = pFVar22 + 1;
        } while (pFVar22 != local_2c0);
        sVar19 = SPV_SUCCESS;
      }
    }
  }
LAB_002c8db6:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_240);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_278);
  return sVar19;
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}